

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

Block * __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::
requisition_block<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0>
          (ConcurrentQueue<_zframe_t_*,_MyTraits> *this)

{
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_00000008;
  Block *block;
  Block *local_8;
  
  local_8 = ConcurrentQueue<_zframe_t_*,_MyTraits>::try_get_block_from_initial_pool
                      (in_stack_00000008);
  if ((local_8 == (Block *)0x0) &&
     (local_8 = ConcurrentQueue<_zframe_t_*,_MyTraits>::try_get_block_from_free_list
                          ((ConcurrentQueue<_zframe_t_*,_MyTraits> *)0x34a7db),
     local_8 == (Block *)0x0)) {
    local_8 = create<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::Block>();
  }
  return local_8;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}
		
		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}
		
		if (canAlloc == CanAlloc) {
			return create<Block>();
		}
		
		return nullptr;
	}